

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O3

void duckdb::ArrowToDuckDBList
               (Vector *vector,ArrowArray *array,ArrowArrayScanState *array_state,idx_t size,
               ArrowType *arrow_type,int64_t nested_offset,ValidityMask *parent_mask,
               int64_t parent_offset)

{
  ValidityMask *mask;
  ulong *puVar1;
  uint *puVar2;
  ArrowScanLocalState *pAVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  ArrowArray *pAVar7;
  unsigned_long *puVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  ArrowVariableSizeType AVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  pointer pAVar15;
  ArrowListInfo *this_00;
  Vector *vector_00;
  long lVar16;
  TemplatedValidityData<unsigned_long> *pTVar17;
  _Head_base<0UL,_unsigned_long_*,_false> _Var18;
  ArrowArrayScanState *array_state_00;
  ArrowType *this_01;
  ulong *puVar19;
  idx_t i;
  ulong uVar20;
  ulong *puVar21;
  ulong uVar22;
  idx_t iVar23;
  ulong uVar24;
  idx_t iVar25;
  idx_t entry_idx;
  uint64_t in_stack_ffffffffffffff50;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  int64_t local_50;
  ArrowListInfo *local_48;
  ArrowArrayScanState *local_40;
  idx_t local_38;
  
  pAVar3 = array_state->state;
  local_40 = array_state;
  pAVar15 = unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
            operator->(&arrow_type->type_info);
  local_48 = ArrowTypeInfo::Cast<duckdb::ArrowListInfo>(pAVar15);
  FlatVector::VerifyFlatVector(vector);
  mask = &vector->validity;
  GetValidityMask(mask,array,(ArrowScanLocalState *)pAVar3->chunk_offset,size,parent_offset,
                  nested_offset,false);
  lVar16 = array->offset + parent_offset + pAVar3->chunk_offset;
  if (nested_offset != -1) {
    lVar16 = nested_offset + array->offset;
  }
  pAVar15 = unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
            operator->(&arrow_type->type_info);
  this_00 = ArrowTypeInfo::Cast<duckdb::ArrowListInfo>(pAVar15);
  AVar11 = ArrowListInfo::GetSizeType(this_00);
  bVar12 = ArrowListInfo::IsView(this_00);
  puVar19 = (ulong *)vector->data;
  if (bVar12) {
    pvVar4 = array->buffers[1];
    pvVar5 = array->buffers[2];
    if (AVar11 == NORMAL) {
      if (size == 0) goto LAB_01546f70;
      puVar2 = (uint *)((long)pvVar4 + lVar16 * 4);
      uVar13 = *puVar2;
      puVar21 = puVar19 + 1;
      iVar23 = 0;
      iVar25 = 0;
      do {
        uVar14 = puVar2[iVar23];
        puVar21[-1] = (ulong)uVar14;
        uVar24 = (ulong)*(uint *)((long)pvVar5 + iVar23 * 4 + lVar16 * 4);
        iVar25 = iVar25 + uVar24;
        if (uVar13 < uVar14) {
          uVar14 = uVar13;
        }
        if (uVar24 == 0) {
          uVar14 = uVar13;
        }
        uVar13 = uVar14;
        *puVar21 = uVar24;
        iVar23 = iVar23 + 1;
        puVar21 = puVar21 + 2;
      } while (size != iVar23);
      if (uVar13 != 0) {
        uVar24 = (ulong)uVar13;
        iVar23 = size;
        do {
          uVar20 = *puVar19 - uVar24;
          if (*puVar19 < uVar24) {
            uVar20 = 0;
          }
          *puVar19 = uVar20;
          puVar19 = puVar19 + 2;
          iVar23 = iVar23 - 1;
        } while (iVar23 != 0);
        goto LAB_01546f76;
      }
    }
    else {
      if (size == 0) goto LAB_01546f70;
      puVar1 = (ulong *)((long)pvVar4 + lVar16 * 8);
      uVar24 = *puVar1;
      puVar21 = puVar19 + 1;
      iVar23 = 0;
      iVar25 = 0;
      do {
        puVar21[-1] = puVar1[iVar23];
        uVar20 = *(ulong *)((long)pvVar5 + iVar23 * 8 + lVar16 * 8);
        *puVar21 = uVar20;
        if ((uVar20 != 0) && (puVar1[iVar23] <= uVar24)) {
          uVar24 = puVar1[iVar23];
        }
        iVar25 = iVar25 + uVar20;
        iVar23 = iVar23 + 1;
        puVar21 = puVar21 + 2;
      } while (size != iVar23);
      if (uVar24 != 0) {
        iVar23 = size;
        do {
          uVar20 = *puVar19 - uVar24;
          if (*puVar19 < uVar24) {
            uVar20 = 0;
          }
          *puVar19 = uVar20;
          puVar19 = puVar19 + 2;
          iVar23 = iVar23 - 1;
        } while (iVar23 != 0);
        goto LAB_01546f76;
      }
    }
  }
  else {
    if (AVar11 == NORMAL) {
      if (size != 0) {
        puVar2 = (uint *)((long)array->buffers[1] + lVar16 * 4);
        uVar24 = (ulong)*puVar2;
        puVar19 = puVar19 + 1;
        iVar25 = 0;
        uVar22 = 0;
        uVar20 = uVar24;
        do {
          puVar19[-1] = uVar22;
          uVar13 = puVar2[iVar25 + 1];
          iVar25 = iVar25 + 1;
          uVar20 = (ulong)(uVar13 - (int)uVar20);
          *puVar19 = uVar20;
          uVar22 = uVar22 + uVar20;
          puVar19 = puVar19 + 2;
          uVar20 = (ulong)uVar13;
        } while (size != iVar25);
        uVar20 = (ulong)puVar2[size];
        goto LAB_01546f6b;
      }
    }
    else if (size != 0) {
      puVar21 = (ulong *)((long)array->buffers[1] + lVar16 * 8);
      uVar24 = *puVar21;
      puVar19 = puVar19 + 1;
      iVar25 = 0;
      uVar20 = 0;
      do {
        puVar19[-1] = uVar20;
        uVar22 = puVar21[iVar25 + 1];
        uVar6 = puVar21[iVar25];
        iVar25 = iVar25 + 1;
        *puVar19 = uVar22 - uVar6;
        uVar20 = uVar20 + (uVar22 - uVar6);
        puVar19 = puVar19 + 2;
      } while (size != iVar25);
      uVar20 = puVar21[size];
LAB_01546f6b:
      iVar25 = uVar20 - uVar24;
      goto LAB_01546f76;
    }
LAB_01546f70:
    iVar25 = 0;
  }
  uVar24 = 0;
LAB_01546f76:
  ListVector::Reserve(vector,iVar25);
  ListVector::SetListSize(vector,iVar25);
  vector_00 = ListVector::GetEntry(vector);
  local_50 = array->offset;
  pAVar7 = *array->children;
  lVar16 = NumericCastImpl<long,_unsigned_long,_false>::Convert(uVar24);
  FlatVector::VerifyFlatVector(vector_00);
  GetValidityMask(&vector_00->validity,pAVar7,(ArrowScanLocalState *)pAVar3->chunk_offset,iVar25,
                  local_50,lVar16,false);
  FlatVector::VerifyFlatVector(vector);
  if ((parent_mask != (ValidityMask *)0x0) &&
     (size != 0 &&
      (parent_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask !=
      (unsigned_long *)0x0)) {
    uVar20 = 0;
    do {
      puVar8 = (parent_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar8 != (unsigned_long *)0x0) {
        if ((puVar8[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) == 0) {
          _Var18._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (_Var18._M_head_impl == (unsigned_long *)0x0) {
            local_38 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_38);
            p_Var10 = p_Stack_60;
            peVar9 = local_68;
            local_68 = (element_type *)0x0;
            p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar9;
            (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var10;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
            }
            pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(vector->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var18._M_head_impl =
                 (pTVar17->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var18._M_head_impl;
          }
          _Var18._M_head_impl[uVar20 >> 6] =
               _Var18._M_head_impl[uVar20 >> 6] & ~(1L << ((byte)uVar20 & 0x3f));
        }
      }
      uVar20 = uVar20 + 1;
    } while (size != uVar20);
  }
  array_state_00 = ArrowArrayScanState::GetChild(local_40,0);
  pAVar7 = *array->children;
  this_01 = ArrowListInfo::GetChild(local_48);
  if (iVar25 == 0 && uVar24 == 0) {
    iVar25 = 0;
    lVar16 = -1;
  }
  else {
    bVar12 = ArrowType::HasDictionary(this_01);
    if (bVar12) {
      lVar16 = NumericCastImpl<long,_unsigned_long,_false>::Convert(uVar24);
      ColumnArrowToDuckDBDictionary
                (vector_00,pAVar7,array_state_00,iVar25,this_01,lVar16,(ValidityMask *)0x0,0);
      return;
    }
    bVar12 = ArrowType::RunEndEncoded(this_01);
    lVar16 = NumericCastImpl<long,_unsigned_long,_false>::Convert(uVar24);
    if (bVar12) {
      ColumnArrowToDuckDBRunEndEncoded
                (vector_00,pAVar7,array_state_00,iVar25,this_01,lVar16,(ValidityMask *)0x0,
                 in_stack_ffffffffffffff50);
      return;
    }
  }
  ColumnArrowToDuckDB(vector_00,pAVar7,array_state_00,iVar25,this_01,lVar16,(ValidityMask *)0x0,0,
                      false);
  return;
}

Assistant:

static void ArrowToDuckDBList(Vector &vector, ArrowArray &array, ArrowArrayScanState &array_state, idx_t size,
                              const ArrowType &arrow_type, int64_t nested_offset, const ValidityMask *parent_mask,
                              int64_t parent_offset) {
	auto &scan_state = array_state.state;

	auto &list_info = arrow_type.GetTypeInfo<ArrowListInfo>();
	SetValidityMask(vector, array, scan_state, size, parent_offset, nested_offset);

	auto effective_offset = GetEffectiveOffset(array, parent_offset, scan_state, nested_offset);
	auto list_data = ConvertArrowListOffsets(vector, array, size, arrow_type, effective_offset);
	auto &start_offset = list_data.start_offset;
	auto &list_size = list_data.list_size;

	ListVector::Reserve(vector, list_size);
	ListVector::SetListSize(vector, list_size);
	auto &child_vector = ListVector::GetEntry(vector);
	SetValidityMask(child_vector, *array.children[0], scan_state, list_size, array.offset,
	                NumericCast<int64_t>(start_offset));
	auto &list_mask = FlatVector::Validity(vector);
	if (parent_mask) {
		//! Since this List is owned by a struct we must guarantee their validity map matches on Null
		if (!parent_mask->AllValid()) {
			for (idx_t i = 0; i < size; i++) {
				if (!parent_mask->RowIsValid(i)) {
					list_mask.SetInvalid(i);
				}
			}
		}
	}
	auto &child_state = array_state.GetChild(0);
	auto &child_array = *array.children[0];
	auto &child_type = list_info.GetChild();

	if (list_size == 0 && start_offset == 0) {
		D_ASSERT(!child_array.dictionary);
		ColumnArrowToDuckDB(child_vector, child_array, child_state, list_size, child_type, -1);
		return;
	}

	auto array_physical_type = GetArrowArrayPhysicalType(child_type);
	switch (array_physical_type) {
	case ArrowArrayPhysicalType::DICTIONARY_ENCODED:
		// TODO: add support for offsets
		ColumnArrowToDuckDBDictionary(child_vector, child_array, child_state, list_size, child_type,
		                              NumericCast<int64_t>(start_offset));
		break;
	case ArrowArrayPhysicalType::RUN_END_ENCODED:
		ColumnArrowToDuckDBRunEndEncoded(child_vector, child_array, child_state, list_size, child_type,
		                                 NumericCast<int64_t>(start_offset));
		break;
	case ArrowArrayPhysicalType::DEFAULT:
		ColumnArrowToDuckDB(child_vector, child_array, child_state, list_size, child_type,
		                    NumericCast<int64_t>(start_offset));
		break;
	default:
		throw NotImplementedException("ArrowArrayPhysicalType not recognized");
	}
}